

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::tree::Section::clean(Section *this)

{
  uint uVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  output;
  iterator position;
  long lineNumber;
  iterator end;
  string content;
  TextRecord text;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  long local_a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  char *local_90;
  long local_88;
  StructureDivision local_70;
  
  uVar1 = NC(this);
  std::__cxx11::string::string((string *)&local_90,(string *)&this->content_);
  local_a8._M_current = local_90;
  local_98._M_current = local_90 + local_88;
  local_a0 = 0;
  (this->content_)._M_string_length = 0;
  *(this->content_)._M_dataplus._M_p = '\0';
  local_b0.container = &this->content_;
  for (; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    TextRecord::TextRecord<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((TextRecord *)&local_70,&local_a8,&local_98,&local_a0,this->mat_,this->mf_,this->mt_)
    ;
    TextRecord::print<std::back_insert_iterator<std::__cxx11::string>>
              ((TextRecord *)&local_70,&local_b0,this->mat_,this->mf_,this->mt_);
    std::__cxx11::string::~string((string *)&local_70);
  }
  sectionEndRecord(&local_70,this->mat_,this->mf_);
  StructureDivision::print<std::back_insert_iterator<std::__cxx11::string>>(&local_70,&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void clean() {

  int NC = this->NC();
  std::string content = this->content();
  auto position = content.begin();
  auto end = content.end();
  long lineNumber = 0;

  this->content_.clear();
  auto output = std::back_inserter( this->content_ );

  while ( NC-- > 0 ) {

    TextRecord text( position, end, lineNumber, this->MAT(), this->MF(), this->MT() );
    text.print( output, this->MAT(), this->MF(), this->MT() );
  }
  SEND( this->MAT(), this->MF() ).print( output );
}